

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subset_iterator.hpp
# Opt level: O3

bool __thiscall
burst::
subset_iterator<const_int_*,_std::less<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
::equal(subset_iterator<const_int_*,_std::less<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
        *this,subset_iterator<const_int_*,_std::less<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
              *that)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  
  if (this->m_begin != that->m_begin) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                  ,0x81,
                  "bool burst::subset_iterator<const int *>::equal(const subset_iterator<ForwardIterator, Compare, SubsetContainer> &) const [ForwardIterator = const int *, Compare = std::less<void>, SubsetContainer = std::vector<const int *>]"
                 );
  }
  if (this->m_end == that->m_end) {
    lVar1 = this->m_subset_size;
    if (lVar1 == that->m_subset_size) {
      if (lVar1 == 0) {
        bVar3 = true;
      }
      else {
        iVar2 = bcmp((this->m_subset).super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (that->m_subset).super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,lVar1 << 3);
        bVar3 = iVar2 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  __assert_fail("this->m_end == that.m_end",
                "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/subset_iterator.hpp"
                ,0x82,
                "bool burst::subset_iterator<const int *>::equal(const subset_iterator<ForwardIterator, Compare, SubsetContainer> &) const [ForwardIterator = const int *, Compare = std::less<void>, SubsetContainer = std::vector<const int *>]"
               );
}

Assistant:

bool equal (const subset_iterator & that) const
        {
            BOOST_ASSERT(this->m_begin == that.m_begin);
            BOOST_ASSERT(this->m_end == that.m_end);
            return
                std::equal
                (
                    this->subset_begin(), this->subset_end(),
                    that.subset_begin(), that.subset_end()
                );
        }